

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::number_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this)

{
  Nonnull<char_*> pcVar1;
  char local_30 [32];
  
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (this->descriptor_->number_,local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,local_30,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::number() {
  return absl::StrCat(descriptor_->number());
}